

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SockData.cpp
# Opt level: O1

SockData * AGSSock::SockData_Create(ags_t size,ags_t byte)

{
  SockData *pSVar1;
  
  pSVar1 = (SockData *)operator_new(0x20);
  (pSVar1->data)._M_dataplus._M_p = (pointer)&(pSVar1->data).field_2;
  std::__cxx11::string::_M_construct((ulong)pSVar1,(char)size);
  (**(code **)(*AGSSockAPI::engine + 0x220))(AGSSockAPI::engine,pSVar1,&agsSockData);
  return pSVar1;
}

Assistant:

SockData *SockData_Create(ags_t size, ags_t byte)
{
	SockData *data = new SockData(size, byte);
	AGS_OBJECT(SockData, data);
	return data;
}